

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport2.c
# Opt level: O1

void ssh2_transport_free(PacketProtocolLayer *ppl)

{
  PktOutQueue *qdest;
  long *plVar1;
  mp_int *pmVar2;
  Interactor *pIVar3;
  host_ca *hca;
  long lVar4;
  
  qdest = ppl->out_pq;
  if (qdest != (PktOutQueue *)0x0) {
    pq_base_concatenate(&qdest->pqb,&qdest->pqb,(PacketQueueBase *)(ppl + -0xc));
  }
  conf_free((Conf *)ppl[-0xc].interactor);
  ssh_ppl_free((PacketProtocolLayer *)ppl[-0xd].ic_process_queue.ctx);
  pq_in_clear((PktInQueue *)&ppl[-0xd].ic_process_queue.queued);
  pq_out_clear((PktOutQueue *)(ppl + -0xc));
  safefree(ppl[-0xc].ssh);
  safefree(ppl[-9].selfptr);
  safefree(ppl[-9].vt);
  safefree(ppl[-9].bpp);
  safefree(ppl[-6].ic_process_queue.ctx);
  strbuf_free((strbuf *)ppl[-6].ic_process_queue.fn);
  while( true ) {
    hca = (host_ca *)delpos234((tree234 *)ppl[-8].bpp,0);
    if (hca == (host_ca *)0x0) break;
    host_ca_free(hca);
  }
  freetree234((tree234 *)ppl[-8].bpp);
  plVar1 = *(long **)&ppl[-6].ic_process_queue.queued;
  if ((plVar1 != (long *)0x0) && (ppl[-1].ssh == (Ssh *)0x0)) {
    (**(code **)(*plVar1 + 0x18))();
    *(undefined8 *)&ppl[-6].ic_process_queue.queued = 0;
  }
  lVar4 = -0x178;
  do {
    safefree(*(void **)((long)&ppl->vt + lVar4));
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != -0xb8);
  if ((mp_int *)ppl[-8].selfptr != (mp_int *)0x0) {
    mp_free((mp_int *)ppl[-8].selfptr);
  }
  pmVar2 = (mp_int *)ppl[-8].ic_process_queue.fn;
  if (pmVar2 != (mp_int *)0x0) {
    mp_free(pmVar2);
  }
  pmVar2 = (mp_int *)ppl[-8].ic_process_queue.ctx;
  if (pmVar2 != (mp_int *)0x0) {
    mp_free(pmVar2);
  }
  if (ppl[-8].logctx != (LogContext *)0x0) {
    strbuf_free((strbuf *)ppl[-8].logctx);
  }
  if ((dh_ctx *)ppl[-10].seat != (dh_ctx *)0x0) {
    dh_cleanup((dh_ctx *)ppl[-10].seat);
  }
  if (*(char *)&ppl[-6].seat == '\x01') {
    ssh_rsakex_freekey((RSAKey *)ppl[-6].logctx);
    safefree(ppl[-6].logctx);
  }
  pIVar3 = ppl[-6].interactor;
  if (pIVar3 != (Interactor *)0x0) {
    (*pIVar3->vt->logpolicy)(pIVar3);
  }
  pIVar3 = ppl[-10].interactor;
  if (pIVar3 != (Interactor *)0x0) {
    (*pIVar3->vt[1].description)(pIVar3);
  }
  strbuf_free((strbuf *)ppl[-8].seat);
  strbuf_free((strbuf *)ppl[-8].interactor);
  ssh_transient_hostkey_cache_free(*(ssh_transient_hostkey_cache **)&ppl[-9].remote_bugs);
  freetree234((tree234 *)ppl[-1].vt);
  expire_timer_context(&ppl[-0xd].ic_process_queue);
  safefree(&ppl[-0xd].ic_process_queue);
  return;
}

Assistant:

static void ssh2_transport_free(PacketProtocolLayer *ppl)
{
    struct ssh2_transport_state *s =
        container_of(ppl, struct ssh2_transport_state, ppl);

    /*
     * As our last act before being freed, move any outgoing packets
     * off our higher layer's output queue on to our own output queue.
     * We might be being freed while the SSH connection is still alive
     * (because we're initiating shutdown from our end), in which case
     * we don't want those last few packets to get lost.
     *
     * (If our owner were to have already destroyed our output pq
     * before wanting to free us, then it would have to reset our
     * publicly visible out_pq field to NULL to inhibit this attempt.
     * But that's not how I expect the shutdown sequence to go in
     * practice.)
     */
    if (s->ppl.out_pq)
        pq_concatenate(s->ppl.out_pq, s->ppl.out_pq, &s->pq_out_higher);

    conf_free(s->conf);

    ssh_ppl_free(s->higher_layer);

    pq_in_clear(&s->pq_in_higher);
    pq_out_clear(&s->pq_out_higher);

    sfree(s->savedhost);
    sfree(s->fullhostname);
    sfree(s->client_greeting);
    sfree(s->server_greeting);
    sfree(s->keystr);
    strbuf_free(s->hostkeyblob);
    {
        host_ca *hca;
        while ( (hca = delpos234(s->host_cas, 0)) )
            host_ca_free(hca);
        freetree234(s->host_cas);
    }
    if (s->hkey && !s->hostkeys) {
        ssh_key_free(s->hkey);
        s->hkey = NULL;
    }
    for (size_t i = 0; i < NKEXLIST; i++)
        sfree(s->kexlists[i].algs);
    if (s->f) mp_free(s->f);
    if (s->p) mp_free(s->p);
    if (s->g) mp_free(s->g);
    if (s->kex_shared_secret) strbuf_free(s->kex_shared_secret);
    if (s->dh_ctx)
        dh_cleanup(s->dh_ctx);
    if (s->rsa_kex_key_needs_freeing) {
        ssh_rsakex_freekey(s->rsa_kex_key);
        sfree(s->rsa_kex_key);
    }
    if (s->ecdh_key)
        ecdh_key_free(s->ecdh_key);
    if (s->exhash)
        ssh_hash_free(s->exhash);
    strbuf_free(s->outgoing_kexinit);
    strbuf_free(s->incoming_kexinit);
    ssh_transient_hostkey_cache_free(s->thc);

    freetree234(s->weak_algorithms_consented_to);

    expire_timer_context(s);
    sfree(s);
}